

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O1

TimerTickResult __thiscall tonk::Connection::onTimerTick(Connection *this)

{
  int *piVar1;
  uint16_t port;
  uint64_t uVar2;
  MappedPortLifetime *pMVar3;
  undefined4 uVar4;
  undefined8 nowUsec;
  bool bVar5;
  TimerTickResult TVar6;
  uint uVar7;
  WindowHeader *nowUsec_00;
  ErrorResult *pEVar8;
  int iVar9;
  int iVar10;
  byte bVar11;
  bool messageSent;
  int recoveryBytesSent;
  Result flushResult;
  undefined1 local_88 [32];
  undefined1 local_68 [48];
  
  nowUsec_00 = (WindowHeader *)siamese::GetTimeUsec();
  LOCK();
  (this->LastTickUsec).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict)nowUsec_00;
  UNLOCK();
  if (((((this->Deps).SocketRefCount)->Shutdown)._M_base._M_i & 1U) != 0) {
    local_68._0_8_ = (__pthread_internal_list *)(local_68 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"App shutdown in progress","");
    pEVar8 = (ErrorResult *)operator_new(0x38);
    pEVar8->Source = "Connection::onTimerTick";
    (pEVar8->Description)._M_dataplus._M_p = (pointer)&(pEVar8->Description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pEVar8->Description,local_68._0_8_,
               (undefined1 *)((long)(__pthread_internal_list **)local_68._0_8_ + local_68._8_8_));
    pEVar8->Type = Tonk;
    pEVar8->Code = 0xc;
    local_88._0_8_ = pEVar8;
    RefCounter::StartShutdown(&(this->super_IConnection).SelfRefCount,0xc,(Result *)local_88);
    Result::~Result((Result *)local_88);
    if ((__pthread_internal_list *)local_68._0_8_ != (__pthread_internal_list *)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_);
    }
  }
  if (((this->super_IConnection).SelfRefCount.Shutdown._M_base._M_i & 1U) == 0) {
    local_88._24_8_ = &(this->super_IConnection).SelfRefCount;
    bVar5 = Timer::IsExpired(&this->NoDataTimer,(uint64_t)nowUsec_00);
    if (bVar5) {
      local_68._0_8_ = (__pthread_internal_list *)(local_68 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"No data from peer (Connection timeout)","");
      pEVar8 = (ErrorResult *)operator_new(0x38);
      pEVar8->Source = "Connection::onTimerTick";
      (pEVar8->Description)._M_dataplus._M_p = (pointer)&(pEVar8->Description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pEVar8->Description,local_68._0_8_,
                 (undefined1 *)((long)(__pthread_internal_list **)local_68._0_8_ + local_68._8_8_));
      pEVar8->Type = Tonk;
      pEVar8->Code = 2;
      local_88._0_8_ = pEVar8;
      RefCounter::StartShutdown((RefCounter *)local_88._24_8_,0xe,(Result *)local_88);
      Result::~Result((Result *)local_88);
      if ((__pthread_internal_list *)local_68._0_8_ != (__pthread_internal_list *)(local_68 + 0x10))
      {
        operator_delete((void *)local_68._0_8_);
      }
      TVar6 = TickAgain;
    }
    else {
      local_88._16_8_ = &this->Outgoing;
      if ((((this->Outgoing).LastAck.PeerNextExpectedSeqNum != (this->Outgoing).NextSequenceNumber)
          && (uVar2 = (this->Outgoing).LastAck.ReceiveUsec, uVar2 != 0)) &&
         (0 < (long)((long)nowUsec_00 + (-300000 - uVar2)))) {
        SenderBandwidthControl::Squelch(&this->SenderControl);
        if (this->RemoteAssignedIdForLocalHost != 0x7fffffff) {
          SessionOutgoing::StartHandshakeC2SUpdateSourceAddress
                    ((SessionOutgoing *)local_88._16_8_,this->EncryptionKey,
                     this->RemoteAssignedIdForLocalHost);
        }
      }
      SenderBandwidthControl::RecalculateAvailableBytes(&this->SenderControl,(uint64_t)nowUsec_00);
      ReceiverBandwidthControl::UpdateSendShape
                (&this->ReceiverControl,(uint64_t)nowUsec_00,(this->CachedReceiverStats).TripUsec);
      pMVar3 = (this->Deps).MappedPort;
      if ((pMVar3 != (MappedPortLifetime *)0x0) &&
         (port = (pMVar3->ExternalMappedPort).super___atomic_base<unsigned_short>._M_i,
         this->LocalNATMapExternalPort != port)) {
        this->LocalNATMapExternalPort = port;
        sendNATMapPortToPeer(this,port);
      }
      if (((this->ConnectionEstablished)._M_base._M_i & 1U) == 0) {
        if (((this->Outgoing).HasPeerAddress._M_base._M_i & 1U) == 0) {
          return TickAgain;
        }
        bVar5 = Timer::IsExpired(&this->TimeSyncTimer,(uint64_t)nowUsec_00);
        if (bVar5) {
          SessionOutgoing::QueueUnreliable
                    ((SessionOutgoing *)(local_68 + 0x30),(MessageType)local_88._16_8_,
                     (uint8_t *)0x4,0);
          Result::~Result((Result *)(local_68 + 0x30));
        }
        SessionOutgoing::Flush((SessionOutgoing *)local_68);
        if ((__pthread_internal_list *)local_68._0_8_ != (__pthread_internal_list *)0x0) {
          RefCounter::StartShutdown((RefCounter *)local_88._24_8_,2,(Result *)local_68);
        }
      }
      else {
        iVar10 = 10;
        local_68._32_8_ = &this->SenderControl;
        local_68._40_8_ = nowUsec_00;
        do {
          local_88._0_8_ = local_88._0_8_ & 0xffffffffffffff00;
          SessionOutgoing::PostRetransmit((SessionOutgoing *)local_68,(bool *)local_88._16_8_);
          if ((__pthread_internal_list *)local_68._0_8_ == (__pthread_internal_list *)0x0) {
            iVar9 = (local_88[0] ^ 1) * 2;
            bVar11 = local_88[0];
          }
          else {
            RefCounter::StartShutdown((RefCounter *)local_88._24_8_,2,(Result *)local_68);
            iVar9 = 1;
            bVar11 = 0;
          }
          Result::~Result((Result *)local_68);
          nowUsec = local_68._40_8_;
          if (bVar11 == 0) goto LAB_00139d78;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
        iVar9 = 2;
LAB_00139d78:
        if (iVar9 != 2) {
          return TickAgain;
        }
        bVar5 = Timer::IsExpired(&this->TimeSyncTimer,local_68._40_8_);
        if (bVar5) {
          onTimeSyncSendTimer(this);
        }
        bVar5 = Timer::IsExpired(&this->AcknowledgementTimer,nowUsec);
        if ((bVar5) || ((this->ReceiverControl).ShouldAckFast == true)) {
          onAckSendTimer(this,nowUsec);
        }
        bVar5 = Timer::IsExpired(&this->AppTimer,nowUsec);
        if (bVar5) {
          (*(this->ConnectionConfig).OnTick)
                    ((this->ConnectionConfig).AppContextPtr,(TonkConnection)this,nowUsec);
        }
        SessionOutgoing::Flush((SessionOutgoing *)local_68);
        if ((__pthread_internal_list *)local_68._0_8_ != (__pthread_internal_list *)0x0) {
          RefCounter::StartShutdown((RefCounter *)local_88._24_8_,2,(Result *)local_68);
        }
        uVar7 = SenderBandwidthControl::CalculateRecoverySendCount
                          ((SenderBandwidthControl *)local_68._32_8_,nowUsec);
        local_88._12_4_ = 0;
        for (; uVar7 != 0; uVar7 = uVar7 - 1) {
          SessionOutgoing::PostRecovery((SessionOutgoing *)local_88,(int *)local_88._16_8_);
          if (local_88._12_4_ == 0) {
            if ((ErrorResult *)local_88._0_8_ != (ErrorResult *)0x0) {
              RefCounter::StartShutdown((RefCounter *)local_88._24_8_,8,(Result *)local_88);
            }
            Result::~Result((Result *)local_88);
            break;
          }
          Result::~Result((Result *)local_88);
        }
        if ((this->SocketConfig->Flags & 1) == 0) {
          do {
            if (((int)((uint)(this->SenderControl).ProbeSendTokens >> 1) < (int)local_88._12_4_) ||
               ((this->SenderControl).AvailableTokens.super___atomic_base<int>._M_i <
                (int)local_88._12_4_)) break;
            SessionOutgoing::PostRecovery((SessionOutgoing *)local_88,(int *)local_88._16_8_);
            uVar4 = local_88._12_4_;
            if (local_88._12_4_ == 0) {
              if ((ErrorResult *)local_88._0_8_ != (ErrorResult *)0x0) {
                RefCounter::StartShutdown((RefCounter *)local_88._24_8_,8,(Result *)local_88);
              }
            }
            else {
              piVar1 = &(this->SenderControl).ProbeSendTokens;
              *piVar1 = *piVar1 + local_88._12_4_ * -2;
            }
            Result::~Result((Result *)local_88);
          } while (uVar4 != 0);
        }
        uVar7 = (this->SenderControl).ProbeSendTokens;
        while (((0xa27 < uVar7 &&
                (0x513 < (this->SenderControl).AvailableTokens.super___atomic_base<int>._M_i)) &&
               (bVar5 = SessionOutgoing::PostDummyDatagram((SessionOutgoing *)local_88._16_8_),
               bVar5))) {
          uVar7 = (this->SenderControl).ProbeSendTokens - 0xa28;
          (this->SenderControl).ProbeSendTokens = uVar7;
        }
      }
      TVar6 = TickAgain;
      Result::~Result((Result *)local_68);
    }
  }
  else {
    TVar6 = onDiscoTimerTick(this);
  }
  return TVar6;
}

Assistant:

Connection::TimerTickResult Connection::onTimerTick()
{
    const uint64_t nowUsec = GetTicksUsec();

#ifdef TONK_DETAILED_STATS
    // Cycle the detail statistics
    Deets.NextWrite();
    Deets.GetWritePtr()->TimestampUsec = nowUsec;
#endif // TONK_DETAILED_STATS

    // If the TonkConnection's parent TonkSocket is shut down:
    if (Deps.SocketRefCount->IsShutdown())
    {
        SelfRefCount.StartShutdown(
            Tonk_AppRequest,
            Result("Connection::onTimerTick", "App shutdown in progress", ErrorType::Tonk, Tonk_AppRequest));
    }

    // If this TonkConnection is disconnected:
    if (SelfRefCount.IsShutdown()) {
        return onDiscoTimerTick();
    }

    // If no data has been received for too long:
    if (NoDataTimer.IsExpired(nowUsec))
    {
        SelfRefCount.StartShutdown(
            Tonk_RemoteTimeout,
            Result("Connection::onTimerTick", "No data from peer (Connection timeout)"));
        return TimerTickResult::TickAgain;
    }

    // If peer should be sending acks but none are received:
    if (!Outgoing.PeerCaughtUp() &&
        Outgoing.GetLastAckReceiveUsec() != 0 &&
        (int64_t)(nowUsec - Outgoing.GetLastAckReceiveUsec() - protocol::kNoAckSquelchTimeoutUsec) > 0)
    {
        // Squelch sender
        SenderControl.Squelch();

        if (RemoteAssignedIdForLocalHost != TONK_INVALID_ID)
        {
            // In case this is a mobile hand-off, start sending source address update tags
            Outgoing.StartHandshakeC2SUpdateSourceAddress(
                EncryptionKey,
                RemoteAssignedIdForLocalHost);
        }
    }

    // Update bandwidth control
    SenderControl.RecalculateAvailableBytes(nowUsec);
    ReceiverControl.UpdateSendShape(nowUsec, CachedReceiverStats.TripUsec);

    // Update NAT external mapped port
    if (Deps.MappedPort)
    {
        const uint16_t externalMappedPort = Deps.MappedPort->ExternalMappedPort;
        if (LocalNATMapExternalPort != externalMappedPort)
        {
            LocalNATMapExternalPort = externalMappedPort;
            sendNATMapPortToPeer(externalMappedPort);
        }
    }

    // If connection is not established yet:
    if (!ConnectionEstablished)
    {
        // If there is no peer address yet, wait longer
        if (!Outgoing.IsPeerAddressValid()) {
            return TimerTickResult::TickAgain;
        }

        // If it is time to run time sync but no session is established:
        if (TimeSyncTimer.IsExpired(nowUsec))
        {
            /*
                Each outgoing datagram will have a handshake footer attached, so
                this code path just needs to make sure there is at least one
                message to send, and to flush datagrams
            */

            // Send a 0-byte padding message frame
            Outgoing.QueueUnreliable(protocol::MessageType_Padding, nullptr, 0);
        }

        // Flush all queued data
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
        // Send at least one packet
        Result flushResult = Outgoing.Flush();
        if (flushResult.IsFail()) {
            SelfRefCount.StartShutdown(Tonk_Error, flushResult);
        }

        return TimerTickResult::TickAgain;
    }

    // Post retransmits up to the protocol limit before adding more data
    for (unsigned i = 0; i < protocol::kRetransmitLimit; ++i)
    {
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
        bool messageSent = false;
        Result retransmitResult = Outgoing.PostRetransmit(messageSent);

        if (retransmitResult.IsFail())
        {
            SelfRefCount.StartShutdown(Tonk_Error, retransmitResult);
            return TimerTickResult::TickAgain;
        }

        if (!messageSent) {
            break;
        }
    }

    /*
        TBD: Should application OnTick() and other things be running from an
        Asio green thread instead of blocking the rest of the code here?
        If the application significantly stalls the timer tick, for example,
        then it may cause inefficient use of the network.  And if the OnData()
        callback is called from a background thread then it would allow us
        to process FEC data in parallel.  Benchmarking needed here.
    */

    // If it is time to send a time sync message:
    if (TimeSyncTimer.IsExpired(nowUsec)) {
        onTimeSyncSendTimer();
    }

    /*
        This will emit a new acknowledgement either on a regular timer,
        or when the receiver bandwidth controller wants to emit a new
        rate control message for the sender to use.

        TBD: Should we gate this also on whether or not an acknowledgement
        might be needed?  Currently not because I do not want to decrease
        the rate at which we send bandwidth shape updates.
    */
    if (AcknowledgementTimer.IsExpired(nowUsec) ||
        (ReceiverControl.GetShouldAckFast()
         /* && Incoming.IsAckRequired() */))
    {
        onAckSendTimer(nowUsec);
    }

    // If it is time to invoke the application OnTick():
    if (AppTimer.IsExpired(nowUsec))
    {
        // Invoke application OnTick
        ConnectionConfig.OnTick(
            ConnectionConfig.AppContextPtr,
            reinterpret_cast<TonkConnection>(this),
            nowUsec);
    }

    // Flush all queued data
    TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
    Result flushResult = Outgoing.Flush();
    if (flushResult.IsFail()) {
        SelfRefCount.StartShutdown(Tonk_Error, flushResult);
    }

    //Logger.Info("this=", this, " AvailBytes = ", SenderControl.GetAvailableBytes(), " ProbeBytes = ", SenderControl.GetAvailableProbeBytes());

    // Calculate amount of recovery data we must send to protect data we've sent
    const unsigned recoveryCount = SenderControl.CalculateRecoverySendCount(nowUsec);
    int recoveryBytesSent = 0;
    for (unsigned i = 0; i < recoveryCount; ++i)
    {
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
        tonk::Result result = Outgoing.PostRecovery(recoveryBytesSent);

        // If recovery packet was not sent:
        if (recoveryBytesSent == 0)
        {
            if (result.IsFail()) {
                SelfRefCount.StartShutdown(Tonk_FECFailed, result);
            }
            break; // Stop here
        }
    }

    // If FEC is enabled for probing bandwidth:
    if ((SocketConfig->Flags & TONK_FLAGS_DISABLE_FEC_BW_PROBES) == 0)
    {
        while (SenderControl.ShouldSendProbe(recoveryBytesSent))
        {
            // Note that recovery packets do not subtract from the bandwidth for
            // app data, but app data subtracts from bandwidth used for probing.

            TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
            tonk::Result result = Outgoing.PostRecovery(recoveryBytesSent);

            // If recovery packet was not sent:
            if (recoveryBytesSent == 0)
            {
                if (result.IsFail()) {
                    SelfRefCount.StartShutdown(Tonk_FECFailed, result);
                }
                break; // Stop here
            }

            SenderControl.SpendProbeBytes(recoveryBytesSent);
        }
    }

    // While there is available bandwidth for more probing:
    while (SenderControl.ShouldSendProbe(protocol::kDummyBytes))
    {
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
        if (!Outgoing.PostDummyDatagram()) {
            break;
        }

        SenderControl.SpendProbeBytes(protocol::kDummyBytes);
    }

    return TimerTickResult::TickAgain;
}